

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_nim.cpp
# Opt level: O0

string * __thiscall
flatbuffers::anon_unknown_0::NimBfbsGenerator::AppendStructBuilderBody
          (string *__return_storage_ptr__,NimBfbsGenerator *this,Object *object,string *prefix)

{
  string *object_00;
  int32_t iVar1;
  anon_class_24_3_9b3bad08 local_138;
  function<void_(const_reflection::Field_*)> local_120;
  string local_100;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_29;
  string *local_28;
  string *prefix_local;
  Object *object_local;
  NimBfbsGenerator *this_local;
  string *code;
  
  local_29 = 0;
  local_28 = prefix;
  prefix_local = (string *)object;
  object_local = (Object *)this;
  this_local = (NimBfbsGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  iVar1 = reflection::Object::minalign((Object *)prefix_local);
  NumToString<int>(&local_d0,iVar1);
  std::operator+(&local_b0,"  self.Prep(",&local_d0);
  std::operator+(&local_90,&local_b0,", ");
  iVar1 = reflection::Object::bytesize((Object *)prefix_local);
  NumToString<int>(&local_100,iVar1);
  std::operator+(&local_70,&local_90,&local_100);
  std::operator+(&local_50,&local_70,")\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  object_00 = prefix_local;
  local_138.code = __return_storage_ptr__;
  local_138.this = this;
  local_138.prefix = prefix;
  std::function<void(reflection::Field_const*)>::
  function<flatbuffers::(anonymous_namespace)::NimBfbsGenerator::AppendStructBuilderBody(reflection::Object_const*,std::__cxx11::string)const::_lambda(reflection::Field_const*)_1_,void>
            ((function<void(reflection::Field_const*)> *)&local_120,&local_138);
  BaseBfbsGenerator::ForAllFields
            (&this->super_BaseBfbsGenerator,(Object *)object_00,true,&local_120);
  std::function<void_(const_reflection::Field_*)>::~function(&local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string AppendStructBuilderBody(const r::Object *object,
                                      std::string prefix = "") const {
    std::string code;
    code += "  self.Prep(" + NumToString(object->minalign()) + ", " +
            NumToString(object->bytesize()) + ")\n";

    // We need to reverse the order we iterate over, since we build the
    // buffer backwards.
    ForAllFields(object, /*reverse=*/true, [&](const r::Field *field) {
      const int32_t num_padding_bytes = field->padding();
      if (num_padding_bytes) {
        code += "  self.Pad(" + NumToString(num_padding_bytes) + ")\n";
      }
      if (IsStructOrTable(field->type()->base_type())) {
        const r::Object *field_object = GetObject(field->type());
        code += AppendStructBuilderBody(field_object,
                                        prefix + namer_.Variable(*field) + "_");
      } else {
        code += "  self.Prepend(" + prefix + namer_.Variable(*field) + ")\n";
      }
    });

    return code;
  }